

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::loadParameters(IMLE<1,_1,_FastLinearExpert> *this,string *fname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  xml_iarchive ia;
  Param newParams;
  ifstream ifs;
  
  Param::Param(&newParams);
  std::ifstream::ifstream(&ifs,(fname->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_370,"IMLE: Could not open file ",fname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ia,
                   &local_370,"!!");
    message(this,(string *)&ia);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive(&ia,(istream *)&ifs,0);
    local_370._M_dataplus._M_p = "newParams";
    local_370._M_string_length = (size_type)&newParams;
    boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::
    load_override<IMLE<1,1,FastLinearExpert>::Param>
              ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&ia,
               (nvp<IMLE<1,_1,_FastLinearExpert>::Param> *)&local_370);
    std::ifstream::close();
    setParameters(this,&newParams);
    boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
              (&ia.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  }
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::_M_dispose();
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}